

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall extract_all::extractfs(extract_all *this,string *name,FileContainer_ptr *fs)

{
  element_type *peVar1;
  anon_class_56_3_659c12bf local_c8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string fssavepath;
  FileContainer_ptr *fs_local;
  string *name_local;
  extract_all *this_local;
  
  fssavepath.field_2._8_8_ = fs;
  std::operator+(&local_60,&this->_dstpath,"/");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,name);
  std::__cxx11::string::~string((string *)&local_60);
  CreateDirPath<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  peVar1 = std::__shared_ptr_access<FileContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<FileContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)fs);
  local_c8.this = this;
  std::shared_ptr<FileContainer>::shared_ptr(&local_c8.fs,fs);
  std::__cxx11::string::string((string *)&local_c8.fssavepath,(string *)local_40);
  std::function<void(std::__cxx11::string_const&)>::
  function<extract_all::extractfs(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)::_lambda(std::__cxx11::string_const&)_1_,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_90,&local_c8);
  (*peVar1->_vptr_FileContainer[10])(peVar1,&local_90);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_90);
  extractfs(std::__cxx11::string_const&,std::shared_ptr<FileContainer>)::
  {lambda(std::__cxx11::string_const&)#1}::~shared_ptr
            ((_lambda_std____cxx11__string_const___1_ *)&local_c8);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void extractfs(const std::string& name, FileContainer_ptr fs)
    {
        std::string fssavepath= _dstpath+"/"+name;
        CreateDirPath(fssavepath);
        fs->filename_enumerator(
            [this,fs,fssavepath](const std::string& romname) {
                try {
                    fs->extractfile(romname, fssavepath+"/"+romname, _filter);
                }
                catch(const char*msg)
                {
                    printf("extractfile: %s: %s\n", romname.c_str(), msg);
                }
            }
        );

    }